

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inspirehand.hpp
# Opt level: O0

bool __thiscall
InspireHand::getAngle
          (InspireHand *this,vector<unsigned_short,_std::allocator<unsigned_short>_> *fingers)

{
  ulong uVar1;
  size_type n;
  ostream *this_00;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  allocator<unsigned_char> local_81;
  undefined1 local_80 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> recvBuf;
  undefined1 local_60 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> sendBuf;
  ProtocolRead<unsigned_short,_6UL,_(unsigned_short)1546> local_34;
  undefined1 local_30 [4];
  ProtoGetAngle p;
  progress_timer t;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *fingers_local;
  InspireHand *this_local;
  
  boost::progress_timer::progress_timer((progress_timer *)local_30,(ostream *)&std::cout);
  ProtocolRead<unsigned_short,_6UL,_(unsigned_short)1546>::ProtocolRead(&local_34,this->_id);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  ProtocolRead<unsigned_short,_6UL,_(unsigned_short)1546>::getRequestBuffer
            (&local_34,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  uVar1 = send(this,(int)local_60,__buf,in_RCX,in_R8D);
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
    recvBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    std::allocator<unsigned_char>::allocator(&local_81);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,0x14,&local_81);
    std::allocator<unsigned_char>::~allocator(&local_81);
    n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
    receive(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,n);
    this_local._7_1_ =
         ProtocolRead<unsigned_short,_6UL,_(unsigned_short)1546>::parseReturnBuffer
                   (&local_34,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,
                    fingers);
    if (!this_local._7_1_) {
      this_00 = std::operator<<((ostream *)&std::cout,"ERROR::InspireHand::GetAngle::Return false");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    recvBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  boost::progress_timer::~progress_timer((progress_timer *)local_30);
  return this_local._7_1_;
}

Assistant:

bool getAngle(std::vector<uint16_t> &fingers) {
//        fingers.clear();
        boost::progress_timer t;
        ProtoGetAngle p(_id);
        std::vector<uint8_t> sendBuf;
        p.getRequestBuffer(sendBuf);
        if(!send(sendBuf)) {
            return false;
        }

        std::vector<uint8_t> recvBuf(12 + 8);
        receive(recvBuf, recvBuf.size());

        if(!p.parseReturnBuffer(recvBuf, fingers)) {
            std::cout << "ERROR::InspireHand::GetAngle::Return false" << std::endl;
            return false;
        }

        return true;
    }